

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::details::full_formatter::format
          (full_formatter *this,log_msg *msg,tm *tm_time,memory_buf_t *dest)

{
  string_view_t view;
  string_view_t view_00;
  string_view_t view_01;
  string_view_t view_02;
  bool bVar1;
  size_t sVar2;
  memory_buf_t *dest_00;
  char *pcVar3;
  buffer<char> *in_RCX;
  basic_string_view<char> *in_RSI;
  time_point in_RDI;
  char *filename;
  duration<long,_std::ratio<1L,_1000L>_> millis;
  __enable_if_is_duration<std::chrono::duration<long>_> secs;
  duration duration;
  memory_buf_t *in_stack_ffffffffffffff18;
  buffer<char> *in_stack_ffffffffffffff20;
  buffer<char> *this_00;
  char *in_stack_ffffffffffffff40;
  memory_buf_t *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff54;
  undefined1 in_stack_ffffffffffffff55;
  undefined1 in_stack_ffffffffffffff56;
  undefined1 in_stack_ffffffffffffff57;
  undefined1 uVar4;
  int in_stack_ffffffffffffff5c;
  duration<long,_std::ratio<1L,_1000L>_> local_50;
  undefined1 local_47;
  undefined1 local_46;
  undefined1 local_45;
  undefined1 local_44;
  undefined1 local_43;
  undefined1 local_42;
  undefined1 local_41;
  rep local_40;
  rep local_38;
  buffer<char> *local_30;
  basic_string_view<char> *local_20;
  char *local_10;
  buffer<char> *local_8;
  
  local_30 = in_RCX;
  local_20 = in_RSI;
  local_38 = (rep)std::chrono::
                  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                  ::time_since_epoch((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                      *)&in_RSI[1].size_);
  local_40 = (rep)std::chrono::
                  duration_cast<std::chrono::duration<long,std::ratio<1l,1l>>,long,std::ratio<1l,1000000000l>>
                            ((duration<long,_std::ratio<1L,_1000000000L>_> *)
                             in_stack_ffffffffffffff18);
  bVar1 = std::chrono::operator!=
                    ((duration<long,_std::ratio<1L,_1L>_> *)in_stack_ffffffffffffff20,
                     (duration<long,_std::ratio<1L,_1L>_> *)in_stack_ffffffffffffff18);
  if (!bVar1) {
    sVar2 = fmt::v9::detail::buffer<char>::size((buffer<char> *)((long)in_RDI.__d.__r + 0x20));
    if (sVar2 != 0) goto LAB_001ee0b3;
  }
  fmt::v9::detail::buffer<char>::clear((buffer<char> *)((long)in_RDI.__d.__r + 0x20));
  local_41 = 0x5b;
  fmt::v9::detail::buffer<char>::push_back
            (in_stack_ffffffffffffff20,(char *)in_stack_ffffffffffffff18);
  fmt_helper::append_int<int>
            (CONCAT13(in_stack_ffffffffffffff57,
                      CONCAT12(in_stack_ffffffffffffff56,
                               CONCAT11(in_stack_ffffffffffffff55,in_stack_ffffffffffffff54))),
             in_stack_ffffffffffffff48);
  local_42 = 0x2d;
  fmt::v9::detail::buffer<char>::push_back
            (in_stack_ffffffffffffff20,(char *)in_stack_ffffffffffffff18);
  fmt_helper::pad2(in_stack_ffffffffffffff5c,
                   (memory_buf_t *)
                   CONCAT17(in_stack_ffffffffffffff57,
                            CONCAT16(in_stack_ffffffffffffff56,
                                     CONCAT15(in_stack_ffffffffffffff55,
                                              CONCAT14(in_stack_ffffffffffffff54,
                                                       in_stack_ffffffffffffff50)))));
  local_43 = 0x2d;
  fmt::v9::detail::buffer<char>::push_back
            (in_stack_ffffffffffffff20,(char *)in_stack_ffffffffffffff18);
  fmt_helper::pad2(in_stack_ffffffffffffff5c,
                   (memory_buf_t *)
                   CONCAT17(in_stack_ffffffffffffff57,
                            CONCAT16(in_stack_ffffffffffffff56,
                                     CONCAT15(in_stack_ffffffffffffff55,
                                              CONCAT14(in_stack_ffffffffffffff54,
                                                       in_stack_ffffffffffffff50)))));
  local_44 = 0x20;
  fmt::v9::detail::buffer<char>::push_back
            (in_stack_ffffffffffffff20,(char *)in_stack_ffffffffffffff18);
  fmt_helper::pad2(in_stack_ffffffffffffff5c,
                   (memory_buf_t *)
                   CONCAT17(in_stack_ffffffffffffff57,
                            CONCAT16(in_stack_ffffffffffffff56,
                                     CONCAT15(in_stack_ffffffffffffff55,
                                              CONCAT14(in_stack_ffffffffffffff54,
                                                       in_stack_ffffffffffffff50)))));
  local_45 = 0x3a;
  fmt::v9::detail::buffer<char>::push_back
            (in_stack_ffffffffffffff20,(char *)in_stack_ffffffffffffff18);
  fmt_helper::pad2(in_stack_ffffffffffffff5c,
                   (memory_buf_t *)
                   CONCAT17(in_stack_ffffffffffffff57,
                            CONCAT16(in_stack_ffffffffffffff56,
                                     CONCAT15(in_stack_ffffffffffffff55,
                                              CONCAT14(in_stack_ffffffffffffff54,
                                                       in_stack_ffffffffffffff50)))));
  local_46 = 0x3a;
  fmt::v9::detail::buffer<char>::push_back
            (in_stack_ffffffffffffff20,(char *)in_stack_ffffffffffffff18);
  fmt_helper::pad2(in_stack_ffffffffffffff5c,
                   (memory_buf_t *)
                   CONCAT17(in_stack_ffffffffffffff57,
                            CONCAT16(in_stack_ffffffffffffff56,
                                     CONCAT15(in_stack_ffffffffffffff55,
                                              CONCAT14(in_stack_ffffffffffffff54,
                                                       in_stack_ffffffffffffff50)))));
  local_47 = 0x2e;
  fmt::v9::detail::buffer<char>::push_back
            (in_stack_ffffffffffffff20,(char *)in_stack_ffffffffffffff18);
  *(rep *)((long)in_RDI.__d.__r + 0x18) = local_40;
LAB_001ee0b3:
  dest_00 = (memory_buf_t *)
            fmt::v9::detail::buffer<char>::begin((buffer<char> *)((long)in_RDI.__d.__r + 0x20));
  fmt::v9::detail::buffer<char>::end((buffer<char> *)((long)in_RDI.__d.__r + 0x20));
  fmt::v9::detail::buffer<char>::append<char>
            ((buffer<char> *)
             CONCAT17(in_stack_ffffffffffffff57,
                      CONCAT16(in_stack_ffffffffffffff56,
                               CONCAT15(in_stack_ffffffffffffff55,
                                        CONCAT14(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50
                                                )))),(char *)in_stack_ffffffffffffff48,
             in_stack_ffffffffffffff40);
  local_50 = fmt_helper::time_fraction<std::chrono::duration<long,std::ratio<1l,1000l>>>(in_RDI);
  std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_50);
  fmt_helper::pad3<unsigned_int>
            ((uint)((ulong)in_stack_ffffffffffffff20 >> 0x20),in_stack_ffffffffffffff18);
  fmt::v9::detail::buffer<char>::push_back
            (in_stack_ffffffffffffff20,(char *)in_stack_ffffffffffffff18);
  fmt::v9::detail::buffer<char>::push_back
            (in_stack_ffffffffffffff20,(char *)in_stack_ffffffffffffff18);
  sVar2 = fmt::v9::basic_string_view<char>::size(local_20);
  if (sVar2 != 0) {
    fmt::v9::detail::buffer<char>::push_back
              (in_stack_ffffffffffffff20,(char *)in_stack_ffffffffffffff18);
    view.size_ = (size_t)in_stack_ffffffffffffff40;
    view.data_ = (char *)in_RDI.__d.__r;
    fmt_helper::append_string_view(view,dest_00);
    fmt::v9::detail::buffer<char>::push_back
              (in_stack_ffffffffffffff20,(char *)in_stack_ffffffffffffff18);
    fmt::v9::detail::buffer<char>::push_back
              (in_stack_ffffffffffffff20,(char *)in_stack_ffffffffffffff18);
  }
  fmt::v9::detail::buffer<char>::push_back
            (in_stack_ffffffffffffff20,(char *)in_stack_ffffffffffffff18);
  sVar2 = fmt::v9::detail::buffer<char>::size(local_30);
  local_20[2].size_ = sVar2;
  level::to_string_view(*(level_enum *)&local_20[1].data_);
  view_00.size_ = (size_t)in_stack_ffffffffffffff40;
  view_00.data_ = (char *)in_RDI.__d.__r;
  fmt_helper::append_string_view(view_00,dest_00);
  pcVar3 = (char *)fmt::v9::detail::buffer<char>::size(local_30);
  local_20[3].data_ = pcVar3;
  fmt::v9::detail::buffer<char>::push_back
            (in_stack_ffffffffffffff20,(char *)in_stack_ffffffffffffff18);
  fmt::v9::detail::buffer<char>::push_back
            (in_stack_ffffffffffffff20,(char *)in_stack_ffffffffffffff18);
  bVar1 = source_loc::empty((source_loc *)&local_20[3].size_);
  if (!bVar1) {
    fmt::v9::detail::buffer<char>::push_back
              (in_stack_ffffffffffffff20,(char *)in_stack_ffffffffffffff18);
    local_10 = short_filename_formatter<spdlog::details::null_scoped_padder>::basename
                         ((char *)local_20[3].size_);
    this_00 = (buffer<char> *)&stack0xffffffffffffff58;
    local_8 = this_00;
    pcVar3 = (char *)std::char_traits<char>::length((char_type *)0x1ee344);
    this_00->ptr_ = pcVar3;
    view_01.size_ = (size_t)in_stack_ffffffffffffff40;
    view_01.data_ = (char *)in_RDI.__d.__r;
    fmt_helper::append_string_view(view_01,dest_00);
    uVar4 = 0x3a;
    fmt::v9::detail::buffer<char>::push_back(this_00,(char *)in_stack_ffffffffffffff18);
    fmt_helper::append_int<int>
              (CONCAT13(uVar4,CONCAT12(in_stack_ffffffffffffff56,
                                       CONCAT11(in_stack_ffffffffffffff55,in_stack_ffffffffffffff54)
                                      )),in_stack_ffffffffffffff48);
    fmt::v9::detail::buffer<char>::push_back(this_00,(char *)in_stack_ffffffffffffff18);
    fmt::v9::detail::buffer<char>::push_back(this_00,(char *)in_stack_ffffffffffffff18);
  }
  view_02.size_ = (size_t)local_20[5].data_;
  view_02.data_ = (char *)in_RDI.__d.__r;
  fmt_helper::append_string_view(view_02,dest_00);
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &tm_time, memory_buf_t &dest) override {
        using std::chrono::duration_cast;
        using std::chrono::milliseconds;
        using std::chrono::seconds;

        // cache the date/time part for the next second.
        auto duration = msg.time.time_since_epoch();
        auto secs = duration_cast<seconds>(duration);

        if (cache_timestamp_ != secs || cached_datetime_.size() == 0) {
            cached_datetime_.clear();
            cached_datetime_.push_back('[');
            fmt_helper::append_int(tm_time.tm_year + 1900, cached_datetime_);
            cached_datetime_.push_back('-');

            fmt_helper::pad2(tm_time.tm_mon + 1, cached_datetime_);
            cached_datetime_.push_back('-');

            fmt_helper::pad2(tm_time.tm_mday, cached_datetime_);
            cached_datetime_.push_back(' ');

            fmt_helper::pad2(tm_time.tm_hour, cached_datetime_);
            cached_datetime_.push_back(':');

            fmt_helper::pad2(tm_time.tm_min, cached_datetime_);
            cached_datetime_.push_back(':');

            fmt_helper::pad2(tm_time.tm_sec, cached_datetime_);
            cached_datetime_.push_back('.');

            cache_timestamp_ = secs;
        }
        dest.append(cached_datetime_.begin(), cached_datetime_.end());

        auto millis = fmt_helper::time_fraction<milliseconds>(msg.time);
        fmt_helper::pad3(static_cast<uint32_t>(millis.count()), dest);
        dest.push_back(']');
        dest.push_back(' ');

        // append logger name if exists
        if (msg.logger_name.size() > 0) {
            dest.push_back('[');
            fmt_helper::append_string_view(msg.logger_name, dest);
            dest.push_back(']');
            dest.push_back(' ');
        }

        dest.push_back('[');
        // wrap the level name with color
        msg.color_range_start = dest.size();
        // fmt_helper::append_string_view(level::to_c_str(msg.level), dest);
        fmt_helper::append_string_view(level::to_string_view(msg.level), dest);
        msg.color_range_end = dest.size();
        dest.push_back(']');
        dest.push_back(' ');

        // add source location if present
        if (!msg.source.empty()) {
            dest.push_back('[');
            const char *filename =
                details::short_filename_formatter<details::null_scoped_padder>::basename(
                    msg.source.filename);
            fmt_helper::append_string_view(filename, dest);
            dest.push_back(':');
            fmt_helper::append_int(msg.source.line, dest);
            dest.push_back(']');
            dest.push_back(' ');
        }
        // fmt_helper::append_string_view(msg.msg(), dest);
        fmt_helper::append_string_view(msg.payload, dest);
    }